

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  char *__nptr;
  URLPatternType UVar1;
  char **ppcVar2;
  bool bVar3;
  CURLcode CVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  size_t len;
  URLGlob *pUVar8;
  char *pcVar9;
  char numbuf [18];
  dynbuf dyn;
  char *local_78;
  char **local_70;
  char local_68 [24];
  dynbuf local_50;
  
  *result = (char *)0x0;
  local_78 = filename;
  local_70 = result;
  curlx_dyn_init(&local_50,0x2800);
  len = 0;
  pcVar6 = "";
  do {
    pcVar9 = local_78;
    if (*local_78 == '#') {
      if (9 < (byte)(local_78[1] - 0x30U)) goto LAB_0011dd3d;
      __nptr = local_78 + 1;
      uVar5 = strtoul(__nptr,&local_78,10);
      if ((uVar5 != 0) && (uVar7 = glob->size, uVar5 < uVar7)) {
        pUVar8 = glob;
        do {
          if (pUVar8->pattern[0].globindex == (int)uVar5 + -1) goto LAB_0011dcfb;
          pUVar8 = (URLGlob *)(pUVar8->pattern + 1);
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      pUVar8 = (URLGlob *)0x0;
LAB_0011dcfb:
      if (pUVar8 == (URLGlob *)0x0) {
        bVar3 = true;
        len = 1;
        local_78 = __nptr;
      }
      else {
        UVar1 = pUVar8->pattern[0].type;
        if (UVar1 == UPTNumRange) {
          pcVar9 = local_68;
          curl_msnprintf(pcVar9,0x12,"%0*ld",pUVar8->pattern[0].content.Set.ptr_s,
                         pUVar8->pattern[0].content.NumRange.ptr_n);
          len = strlen(pcVar9);
          bVar3 = true;
        }
        else if (UVar1 == UPTCharRange) {
          local_68[0] = pUVar8->pattern[0].content.CharRange.ptr_c;
          local_68[1] = 0;
          bVar3 = true;
          len = 1;
          pcVar9 = local_68;
        }
        else {
          pcVar9 = pcVar6;
          if (UVar1 == UPTSet) {
            ppcVar2 = pUVar8->pattern[0].content.Set.elements;
            bVar3 = true;
            if (ppcVar2 != (char **)0x0) {
              pcVar9 = ppcVar2[pUVar8->pattern[0].content.Set.ptr_s];
              len = strlen(pcVar9);
            }
          }
          else {
            bVar3 = false;
            curl_mfprintf(tool_stderr,"internal error: invalid pattern type (%d)\n");
            curlx_dyn_free(&local_50);
          }
        }
      }
      if (!bVar3) {
        return CURLE_FAILED_INIT;
      }
    }
    else {
      if (*local_78 == '\0') {
        CVar4 = curlx_dyn_addn(&local_50,"",0);
        if (CVar4 != CURLE_OK) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar6 = curlx_dyn_ptr(&local_50);
        *local_70 = pcVar6;
        return CURLE_OK;
      }
LAB_0011dd3d:
      len = 1;
      local_78 = local_78 + 1;
    }
    CVar4 = curlx_dyn_addn(&local_50,pcVar9,len);
    pcVar6 = pcVar9;
    if (CVar4 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, struct URLGlob *glob)
{
  char numbuf[18];
  char *appendthis = (char *)"";
  size_t appendlen = 0;
  struct curlx_dynbuf dyn;

  *result = NULL;

  /* We cannot use the glob_buffer for storage since the filename may be
   * longer than the URL we use.
   */
  curlx_dyn_init(&dyn, MAX_OUTPUT_GLOB_LENGTH);

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      struct URLPattern *pat = NULL;

      if(num && (num < glob->size)) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*" CURL_FORMAT_CURL_OFF_T,
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(tool_stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          curlx_dyn_free(&dyn);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(curlx_dyn_addn(&dyn, appendthis, appendlen))
      return CURLE_OUT_OF_MEMORY;
  }

  if(curlx_dyn_addn(&dyn, "", 0))
    return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, curlx_dyn_ptr(&dyn),
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    curlx_dyn_free(&dyn);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *result = sanitized;
    return CURLE_OK;
  }
#else
  *result = curlx_dyn_ptr(&dyn);
  return CURLE_OK;
#endif /* _WIN32 || MSDOS */
}